

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CNode::MarkReceivedMsgsForProcessing(CNode *this)

{
  list<CNetMessage,_std::allocator<CNetMessage>_> *__offin;
  long lVar1;
  _List_node_base *p_Var2;
  int __fdout;
  __off64_t *__offout;
  size_t __len;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock101;
  uint in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __offin = &this->vRecvMsg;
  lVar3 = 0;
  p_Var2 = (_List_node_base *)__offin;
  while (p_Var2 = (((_List_base<CNetMessage,_std::allocator<CNetMessage>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)__offin) {
    lVar3 = lVar3 + (ulong)*(uint *)((long)&p_Var2[3]._M_prev + 4);
  }
  __fdout = 0xcad8a1;
  __offout = (__off64_t *)0xee0;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&stack0xffffffffffffffc8,
             &this->m_msg_process_queue_mutex,"m_msg_process_queue_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xee0,false);
  std::__cxx11::list<CNetMessage,_std::allocator<CNetMessage>_>::splice
            (&this->m_msg_process_queue,(int)&this->m_msg_process_queue,(__off64_t *)__offin,__fdout
             ,__offout,__len,in_stack_ffffffffffffffc8);
  uVar4 = lVar3 + this->m_msg_process_queue_size;
  this->m_msg_process_queue_size = uVar4;
  LOCK();
  (this->fPauseRecv)._M_base._M_i = this->m_recv_flood_size < uVar4;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::MarkReceivedMsgsForProcessing()
{
    AssertLockNotHeld(m_msg_process_queue_mutex);

    size_t nSizeAdded = 0;
    for (const auto& msg : vRecvMsg) {
        // vRecvMsg contains only completed CNetMessage
        // the single possible partially deserialized message are held by TransportDeserializer
        nSizeAdded += msg.m_raw_message_size;
    }

    LOCK(m_msg_process_queue_mutex);
    m_msg_process_queue.splice(m_msg_process_queue.end(), vRecvMsg);
    m_msg_process_queue_size += nSizeAdded;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;
}